

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int cm_zlib_deflate(z_streamp strm,int flush)

{
  Bytef *pBVar1;
  uint uVar2;
  deflate_state *s;
  Bytef *pBVar3;
  ulg uVar4;
  Posf *__s;
  long lVar5;
  Bytef BVar6;
  int iVar7;
  uint uVar8;
  block_state bVar9;
  uLong uVar10;
  gz_headerp pgVar11;
  uInt uVar12;
  ulg uVar13;
  long lVar14;
  uInt uVar15;
  Bytef *pBVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  long local_48;
  int local_40;
  
  iVar7 = deflateStateCheck(strm);
  if (5 < (uint)flush) {
    return -2;
  }
  if (iVar7 != 0) {
    return -2;
  }
  if (strm->next_out == (Bytef *)0x0) {
LAB_00221615:
    strm->msg = "stream error";
    return -2;
  }
  s = strm->state;
  uVar15 = strm->avail_in;
  if (((uVar15 != 0) && (strm->next_in == (Bytef *)0x0)) ||
     (iVar7 = s->status, flush != 4 && iVar7 == 0x29a)) goto LAB_00221615;
  if (strm->avail_out == 0) {
LAB_002216fd:
    strm->msg = "buffer error";
    return -5;
  }
  iVar25 = s->last_flush;
  s->last_flush = flush;
  if (s->pending == 0) {
    if (uVar15 == 0) {
      if ((flush != 4) &&
         ((int)((uint)((uint)flush < 5) * 9 + flush * 2 + -9) <=
          (int)((uint)(iVar25 < 5) * 9 + iVar25 * 2 + -9))) goto LAB_002216fd;
    }
  }
  else {
    flush_pending(strm);
    if (strm->avail_out == 0) goto LAB_00222488;
    iVar7 = s->status;
  }
  if (iVar7 == 0x2a) {
    if (s->wrap == 0) {
      s->status = 0x71;
    }
    else {
      uVar8 = s->w_bits * 0x1000 - 0x7800;
      uVar26 = 0;
      if ((s->strategy < 2) && (uVar2 = s->level, 1 < (int)uVar2)) {
        if (uVar2 < 6) {
          uVar26 = 0x40;
        }
        else {
          uVar26 = (uVar2 != 6 | 2) << 6;
        }
      }
      uVar2 = uVar26 + 0x20 + uVar8;
      if (s->strstart == 0) {
        uVar2 = uVar26 | uVar8;
      }
      putShortMSB(s,(uVar2 | uVar2 % 0x1f) ^ 0x1f);
      if (s->strstart != 0) {
        putShortMSB(s,*(uInt *)((long)&strm->adler + 2));
        putShortMSB(s,(uint)(ushort)strm->adler);
      }
      uVar10 = cm_zlib_adler32(0,(Bytef *)0x0,0);
      strm->adler = uVar10;
      s->status = 0x71;
      flush_pending(strm);
      if (s->pending != 0) goto LAB_00222521;
      iVar7 = s->status;
LAB_002217a9:
      if (iVar7 == 0x39) {
        uVar10 = cm_zlib_z_crc32(0,(uchar *)0x0,0);
        strm->adler = uVar10;
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\x1f';
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = 0x8b;
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = '\b';
        pgVar11 = s->gzhead;
        if (pgVar11 == (gz_headerp)0x0) {
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = '\0';
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = '\0';
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = '\0';
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = '\0';
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = '\0';
          BVar6 = '\x02';
          if (s->level != 9) {
            BVar6 = (s->level < 2 || 1 < s->strategy) << 2;
          }
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = BVar6;
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = '\x03';
          s->status = 0x71;
          flush_pending(strm);
          if (s->pending != 0) goto LAB_00222488;
          iVar7 = s->status;
          goto LAB_00221a45;
        }
        iVar7 = pgVar11->text;
        iVar25 = pgVar11->hcrc;
        pBVar16 = pgVar11->extra;
        pBVar1 = pgVar11->name;
        pBVar3 = pgVar11->comment;
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] =
             (pBVar3 != (Bytef *)0x0) << 4 |
             (pBVar1 != (Bytef *)0x0) << 3 |
             (pBVar16 != (Bytef *)0x0) << 2 | (iVar25 != 0) * '\x02' | iVar7 != 0;
        uVar10 = s->gzhead->time;
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = (Bytef)uVar10;
        BVar6 = *(Bytef *)((long)&s->gzhead->time + 1);
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        BVar6 = *(Bytef *)((long)&s->gzhead->time + 2);
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        BVar6 = *(Bytef *)((long)&s->gzhead->time + 3);
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        BVar6 = '\x02';
        if (s->level != 9) {
          BVar6 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        iVar7 = s->gzhead->os;
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = (Bytef)iVar7;
        pgVar11 = s->gzhead;
        if (pgVar11->extra != (Bytef *)0x0) {
          uVar15 = pgVar11->extra_len;
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = (Bytef)uVar15;
          BVar6 = *(Bytef *)((long)&s->gzhead->extra_len + 1);
          uVar13 = s->pending;
          s->pending = uVar13 + 1;
          s->pending_buf[uVar13] = BVar6;
          pgVar11 = s->gzhead;
        }
        if (pgVar11->hcrc != 0) {
          uVar10 = cm_zlib_z_crc32(strm->adler,s->pending_buf,(uInt)s->pending);
          strm->adler = uVar10;
        }
        s->gzindex = 0;
        s->status = 0x45;
LAB_00221a69:
        if (s->gzhead->extra != (Bytef *)0x0) {
          uVar13 = s->pending;
          uVar8 = (uint)(ushort)s->gzhead->extra_len - (int)s->gzindex;
          do {
            uVar22 = (ulong)uVar8;
            if (uVar22 + uVar13 <= s->pending_buf_size) {
              memcpy(s->pending_buf + uVar13,s->gzhead->extra + s->gzindex,uVar22);
              uVar22 = uVar22 + s->pending;
              s->pending = uVar22;
              if ((s->gzhead->hcrc != 0) && (uVar13 < uVar22)) {
                uVar10 = cm_zlib_z_crc32(strm->adler,s->pending_buf + uVar13,
                                         (int)uVar22 - (int)uVar13);
                strm->adler = uVar10;
              }
              s->gzindex = 0;
              goto LAB_00221b6b;
            }
            uVar19 = s->pending_buf_size - uVar13;
            uVar18 = uVar19 & 0xffffffff;
            memcpy(s->pending_buf + uVar13,s->gzhead->extra + s->gzindex,uVar18);
            uVar22 = s->pending_buf_size;
            s->pending = uVar22;
            if (uVar13 < uVar22 && s->gzhead->hcrc != 0) {
              uVar10 = cm_zlib_z_crc32(strm->adler,s->pending_buf + uVar13,(int)uVar22 - (int)uVar13
                                      );
              strm->adler = uVar10;
            }
            s->gzindex = s->gzindex + uVar18;
            flush_pending(strm);
            uVar8 = uVar8 - (int)uVar19;
            uVar13 = 0;
          } while (s->pending == 0);
          goto LAB_00222488;
        }
LAB_00221b6b:
        s->status = 0x49;
LAB_00221b73:
        if (s->gzhead->name != (Bytef *)0x0) {
          uVar13 = s->pending;
          do {
            uVar22 = s->pending;
            pgVar11 = s->gzhead;
            if (uVar22 == s->pending_buf_size) {
              if (uVar13 < uVar22 && pgVar11->hcrc != 0) {
                uVar10 = cm_zlib_z_crc32(strm->adler,s->pending_buf + uVar13,
                                         (int)uVar22 - (int)uVar13);
                strm->adler = uVar10;
              }
              flush_pending(strm);
              if (s->pending != 0) goto LAB_00222488;
              pgVar11 = s->gzhead;
              uVar22 = 0;
              uVar13 = 0;
            }
            pBVar16 = pgVar11->name;
            uVar4 = s->gzindex;
            s->gzindex = uVar4 + 1;
            BVar6 = pBVar16[uVar4];
            s->pending = uVar22 + 1;
            s->pending_buf[uVar22] = BVar6;
          } while (BVar6 != '\0');
          if ((s->gzhead->hcrc != 0) && (uVar13 < s->pending)) {
            uVar10 = cm_zlib_z_crc32(strm->adler,s->pending_buf + uVar13,
                                     (int)s->pending - (int)uVar13);
            strm->adler = uVar10;
          }
          s->gzindex = 0;
        }
        s->status = 0x5b;
LAB_00221c38:
        if (s->gzhead->comment != (Bytef *)0x0) {
          uVar13 = s->pending;
          do {
            uVar22 = s->pending;
            pgVar11 = s->gzhead;
            if (uVar22 == s->pending_buf_size) {
              if (uVar13 < uVar22 && pgVar11->hcrc != 0) {
                uVar10 = cm_zlib_z_crc32(strm->adler,s->pending_buf + uVar13,
                                         (int)uVar22 - (int)uVar13);
                strm->adler = uVar10;
              }
              flush_pending(strm);
              if (s->pending != 0) goto LAB_00222488;
              pgVar11 = s->gzhead;
              uVar22 = 0;
              uVar13 = 0;
            }
            pBVar16 = pgVar11->comment;
            uVar4 = s->gzindex;
            s->gzindex = uVar4 + 1;
            BVar6 = pBVar16[uVar4];
            s->pending = uVar22 + 1;
            s->pending_buf[uVar22] = BVar6;
          } while (BVar6 != '\0');
          if ((s->gzhead->hcrc != 0) && (uVar13 < s->pending)) {
            uVar10 = cm_zlib_z_crc32(strm->adler,s->pending_buf + uVar13,
                                     (int)s->pending - (int)uVar13);
            strm->adler = uVar10;
          }
        }
        s->status = 0x67;
      }
      else {
LAB_00221a45:
        if (iVar7 != 0x67) {
          if (iVar7 == 0x49) goto LAB_00221b73;
          if (iVar7 != 0x5b) {
            if (iVar7 != 0x45) goto LAB_00221d7b;
            goto LAB_00221a69;
          }
          goto LAB_00221c38;
        }
      }
      if (s->gzhead->hcrc != 0) {
        uVar13 = s->pending;
        if (s->pending_buf_size < uVar13 + 2) {
          flush_pending(strm);
          uVar13 = 0;
          if (s->pending != 0) goto LAB_00222521;
        }
        uVar10 = strm->adler;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = (Bytef)uVar10;
        BVar6 = *(Bytef *)((long)&strm->adler + 1);
        uVar13 = s->pending;
        s->pending = uVar13 + 1;
        s->pending_buf[uVar13] = BVar6;
        uVar10 = cm_zlib_z_crc32(0,(uchar *)0x0,0);
        strm->adler = uVar10;
      }
      s->status = 0x71;
      flush_pending(strm);
      if (s->pending != 0) goto LAB_00222488;
    }
LAB_00221d7b:
    if (strm->avail_in == 0) goto LAB_00221d81;
  }
  else {
    if (iVar7 != 0x29a) goto LAB_002217a9;
    if (strm->avail_in != 0) goto LAB_002216fd;
LAB_00221d81:
    if (s->lookahead == 0) {
      if (flush == 0) {
        return 0;
      }
      if (s->status == 0x29a) goto LAB_002223b5;
    }
  }
  if ((long)s->level == 0) {
    bVar9 = deflate_stored(s,flush);
    goto LAB_0022231c;
  }
  if (s->strategy == 3) {
LAB_00221efa:
    do {
      uVar8 = s->lookahead;
      if (uVar8 < 0x103) {
        fill_window(s);
        uVar8 = s->lookahead;
        if (flush == 0 && uVar8 < 0x103) break;
        if (uVar8 == 0) goto LAB_0022229b;
        s->match_length = 0;
        uVar15 = s->strstart;
        if (2 < uVar8) goto LAB_00221f65;
        pBVar16 = s->window;
LAB_0022206a:
        uVar12 = s->sym_next;
        uVar22 = (ulong)uVar15;
LAB_00222073:
        bVar24 = pBVar16[uVar22];
        s->sym_next = uVar12 + 1;
        s->sym_buf[uVar12] = '\0';
        uVar8 = s->sym_next;
        s->sym_next = uVar8 + 1;
        s->sym_buf[uVar8] = '\0';
        uVar8 = s->sym_next;
        s->sym_next = uVar8 + 1;
        s->sym_buf[uVar8] = bVar24;
        s->dyn_ltree[bVar24].fc.freq = s->dyn_ltree[bVar24].fc.freq + 1;
        s->lookahead = s->lookahead - 1;
        uVar8 = s->strstart + 1;
        s->strstart = uVar8;
        if (s->sym_next != s->sym_end) goto LAB_00221efa;
      }
      else {
        s->match_length = 0;
        uVar15 = s->strstart;
LAB_00221f65:
        pBVar16 = s->window;
        if (uVar15 == 0) {
          uVar15 = 0;
          goto LAB_0022206a;
        }
        uVar22 = (ulong)uVar15;
        BVar6 = pBVar16[uVar22 - 1];
        if (((BVar6 != pBVar16[uVar22]) || (pBVar1 = pBVar16 + uVar22, BVar6 != pBVar1[1])) ||
           (BVar6 != pBVar1[2])) goto LAB_0022206a;
        local_40 = (int)pBVar1 + 0x102;
        lVar27 = uVar22 + 2;
        local_48 = uVar22 + 4;
        lVar20 = uVar22 + 5;
        lVar21 = uVar22 + 6;
        lVar17 = uVar22 + 7;
        lVar14 = uVar22 + 9;
        uVar18 = 2;
        lVar23 = uVar22 + 3;
        uVar19 = uVar22;
        do {
          uVar19 = uVar19 + 8;
          iVar7 = (int)pBVar16;
          if (BVar6 != pBVar16[lVar23]) {
            iVar25 = (int)lVar23 + iVar7;
            goto LAB_0022217e;
          }
          if (BVar6 != pBVar16[lVar23 + 1]) {
            iVar25 = (int)local_48;
            break;
          }
          if (BVar6 != pBVar16[lVar23 + 2]) {
            iVar25 = (int)lVar20 + iVar7;
            goto LAB_0022217e;
          }
          if (BVar6 != pBVar16[lVar23 + 3]) {
            iVar25 = (int)lVar21 + iVar7;
            goto LAB_0022217e;
          }
          if (BVar6 != pBVar16[lVar23 + 4]) {
            iVar25 = (int)lVar17 + iVar7;
            goto LAB_0022217e;
          }
          if (BVar6 != pBVar16[lVar23 + 5]) {
            iVar25 = (int)uVar19 + iVar7;
            goto LAB_0022217e;
          }
          if (BVar6 != pBVar16[lVar23 + 6]) {
            iVar25 = (int)lVar14 + iVar7;
            goto LAB_0022217e;
          }
          lVar27 = lVar27 + 8;
          iVar25 = (int)lVar27;
          if (0xf9 < uVar18) break;
          uVar18 = uVar18 + 8;
          local_48 = local_48 + 8;
          lVar20 = lVar20 + 8;
          lVar21 = lVar21 + 8;
          lVar17 = lVar17 + 8;
          lVar14 = lVar14 + 8;
          lVar5 = lVar23 + 7;
          lVar23 = lVar23 + 8;
        } while (BVar6 == pBVar16[lVar5]);
        iVar25 = iVar25 + iVar7;
LAB_0022217e:
        uVar26 = (iVar25 - local_40) + 0x102;
        if (uVar8 <= uVar26) {
          uVar26 = uVar8;
        }
        s->match_length = uVar26;
        uVar12 = s->sym_next;
        if (uVar26 < 3) goto LAB_00222073;
        bVar24 = (char)uVar26 - 3;
        s->sym_next = uVar12 + 1;
        s->sym_buf[uVar12] = '\x01';
        uVar8 = s->sym_next;
        s->sym_next = uVar8 + 1;
        s->sym_buf[uVar8] = '\0';
        uVar8 = s->sym_next;
        s->sym_next = uVar8 + 1;
        s->sym_buf[uVar8] = bVar24;
        s->dyn_ltree[(ulong)""[bVar24] + 0x101].fc.freq =
             s->dyn_ltree[(ulong)""[bVar24] + 0x101].fc.freq + 1;
        s->dyn_dtree[0].fc.freq = s->dyn_dtree[0].fc.freq + 1;
        s->lookahead = s->lookahead - s->match_length;
        uVar8 = s->match_length + s->strstart;
        s->match_length = 0;
        s->strstart = uVar8;
        if (s->sym_next != s->sym_end) goto LAB_00221efa;
      }
      uVar22 = s->block_start;
      if ((long)uVar22 < 0) {
        pBVar16 = (Bytef *)0x0;
      }
      else {
        pBVar16 = s->window + (uVar22 & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)pBVar16,uVar8 - uVar22,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
    } while (s->strm->avail_out != 0);
  }
  else {
    if (s->strategy != 2) {
      bVar9 = (*configuration_table[s->level].func)(s,flush);
      goto LAB_0022231c;
    }
    do {
      do {
        if ((s->lookahead == 0) && (fill_window(s), s->lookahead == 0)) {
          if (flush != 0) goto LAB_0022229b;
          goto LAB_00222514;
        }
        s->match_length = 0;
        bVar24 = s->window[s->strstart];
        uVar8 = s->sym_next;
        s->sym_next = uVar8 + 1;
        s->sym_buf[uVar8] = '\0';
        uVar8 = s->sym_next;
        s->sym_next = uVar8 + 1;
        s->sym_buf[uVar8] = '\0';
        uVar8 = s->sym_next;
        s->sym_next = uVar8 + 1;
        s->sym_buf[uVar8] = bVar24;
        s->dyn_ltree[bVar24].fc.freq = s->dyn_ltree[bVar24].fc.freq + 1;
        s->lookahead = s->lookahead - 1;
        uVar8 = s->strstart + 1;
        s->strstart = uVar8;
      } while (s->sym_next != s->sym_end);
      uVar22 = s->block_start;
      if ((long)uVar22 < 0) {
        pBVar16 = (Bytef *)0x0;
      }
      else {
        pBVar16 = s->window + (uVar22 & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)pBVar16,uVar8 - uVar22,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
    } while (s->strm->avail_out != 0);
  }
LAB_00222514:
  if (strm->avail_out != 0) {
    return 0;
  }
LAB_00222521:
  s->last_flush = -1;
  return 0;
LAB_0022229b:
  s->insert = 0;
  if (flush == 4) {
    uVar22 = s->block_start;
    if ((long)uVar22 < 0) {
      pBVar16 = (Bytef *)0x0;
    }
    else {
      pBVar16 = s->window + (uVar22 & 0xffffffff);
    }
    cm_zlib__tr_flush_block(s,(charf *)pBVar16,s->strstart - uVar22,1);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    bVar9 = finish_done - (s->strm->avail_out == 0);
LAB_0022231c:
    if ((bVar9 & ~block_done) == finish_started) {
      s->status = 0x29a;
    }
    if ((bVar9 & ~finish_started) == need_more) goto LAB_00222514;
    if (bVar9 != block_done) goto LAB_002223b5;
  }
  else if (s->sym_next != 0) {
    uVar22 = s->block_start;
    if ((long)uVar22 < 0) {
      pBVar16 = (Bytef *)0x0;
    }
    else {
      pBVar16 = s->window + (uVar22 & 0xffffffff);
    }
    cm_zlib__tr_flush_block(s,(charf *)pBVar16,s->strstart - uVar22,0);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    if (s->strm->avail_out == 0) goto LAB_00222514;
  }
  if (flush != 5) {
    if (flush == 1) {
      cm_zlib__tr_align(s);
    }
    else {
      cm_zlib__tr_stored_block(s,(charf *)0x0,0,0);
      if (flush == 3) {
        __s = s->head;
        uVar22 = (ulong)(s->hash_size - 1);
        __s[uVar22] = 0;
        memset(__s,0,uVar22 * 2);
        if (s->lookahead == 0) {
          s->strstart = 0;
          s->block_start = 0;
          s->insert = 0;
        }
      }
    }
  }
  flush_pending(strm);
  if (strm->avail_out == 0) {
LAB_00222488:
    s->last_flush = -1;
    return 0;
  }
LAB_002223b5:
  if (flush != 4) {
    return 0;
  }
  if (0 < s->wrap) {
    uVar10 = strm->adler;
    if (s->wrap == 2) {
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = (Bytef)uVar10;
      BVar6 = *(Bytef *)((long)&strm->adler + 1);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->adler + 2);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->adler + 3);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      uVar10 = strm->total_in;
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = (Bytef)uVar10;
      BVar6 = *(Bytef *)((long)&strm->total_in + 1);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->total_in + 2);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
      BVar6 = *(Bytef *)((long)&strm->total_in + 3);
      uVar13 = s->pending;
      s->pending = uVar13 + 1;
      s->pending_buf[uVar13] = BVar6;
    }
    else {
      putShortMSB(s,(uInt)(uVar10 >> 0x10));
      putShortMSB(s,(uint)(ushort)strm->adler);
    }
    flush_pending(strm);
    if (0 < s->wrap) {
      s->wrap = -s->wrap;
    }
    return (uint)(s->pending == 0);
  }
  return 1;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (deflateStateCheck(strm) || flush > Z_BLOCK || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->avail_in != 0 && strm->next_in == Z_NULL) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && RANK(flush) <= RANK(old_flush) &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Write the header */
    if (s->status == INIT_STATE && s->wrap == 0)
        s->status = BUSY_STATE;
    if (s->status == INIT_STATE) {
        /* zlib header */
        uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
        uInt level_flags;

        if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
            level_flags = 0;
        else if (s->level < 6)
            level_flags = 1;
        else if (s->level == 6)
            level_flags = 2;
        else
            level_flags = 3;
        header |= (level_flags << 6);
        if (s->strstart != 0) header |= PRESET_DICT;
        header += 31 - (header % 31);

        putShortMSB(s, header);

        /* Save the adler32 of the preset dictionary: */
        if (s->strstart != 0) {
            putShortMSB(s, (uInt)(strm->adler >> 16));
            putShortMSB(s, (uInt)(strm->adler & 0xffff));
        }
        strm->adler = adler32(0L, Z_NULL, 0);
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#ifdef GZIP
    if (s->status == GZIP_STATE) {
        /* gzip header */
        strm->adler = crc32(0L, Z_NULL, 0);
        put_byte(s, 31);
        put_byte(s, 139);
        put_byte(s, 8);
        if (s->gzhead == Z_NULL) {
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, 0);
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, OS_CODE);
            s->status = BUSY_STATE;

            /* Compression must start with an empty pending buffer */
            flush_pending(strm);
            if (s->pending != 0) {
                s->last_flush = -1;
                return Z_OK;
            }
        }
        else {
            put_byte(s, (s->gzhead->text ? 1 : 0) +
                     (s->gzhead->hcrc ? 2 : 0) +
                     (s->gzhead->extra == Z_NULL ? 0 : 4) +
                     (s->gzhead->name == Z_NULL ? 0 : 8) +
                     (s->gzhead->comment == Z_NULL ? 0 : 16)
                     );
            put_byte(s, (Byte)(s->gzhead->time & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
            put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                      4 : 0));
            put_byte(s, s->gzhead->os & 0xff);
            if (s->gzhead->extra != Z_NULL) {
                put_byte(s, s->gzhead->extra_len & 0xff);
                put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
            }
            if (s->gzhead->hcrc)
                strm->adler = crc32(strm->adler, s->pending_buf,
                                    s->pending);
            s->gzindex = 0;
            s->status = EXTRA_STATE;
        }
    }
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            uInt left = (s->gzhead->extra_len & 0xffff) - s->gzindex;
            while (s->pending + left > s->pending_buf_size) {
                uInt copy = s->pending_buf_size - s->pending;
                zmemcpy(s->pending_buf + s->pending,
                        s->gzhead->extra + s->gzindex, copy);
                s->pending = s->pending_buf_size;
                HCRC_UPDATE(beg);
                s->gzindex += copy;
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
                beg = 0;
                left -= copy;
            }
            zmemcpy(s->pending_buf + s->pending,
                    s->gzhead->extra + s->gzindex, left);
            s->pending += left;
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != Z_NULL) {
            ulg beg = s->pending;   /* start of bytes to update crc */
            int val;
            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    flush_pending(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
        }
        s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size) {
                flush_pending(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
            }
            put_byte(s, (Byte)(strm->adler & 0xff));
            put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
            strm->adler = crc32(0L, Z_NULL, 0);
        }
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        flush_pending(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#endif

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = s->level == 0 ? deflate_stored(s, flush) :
                 s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                 s->strategy == Z_RLE ? deflate_rle(s, flush) :
                 (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0L;
                        s->insert = 0;
                    }
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}